

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

PlsFormat pls_format(char *str)

{
  int iVar1;
  PlsFormat PVar2;
  
  iVar1 = strcmp(str,"r11f_g11f_b10f");
  if (iVar1 == 0) {
    PVar2 = PlsR11FG11FB10F;
  }
  else {
    iVar1 = strcmp(str,"r32f");
    if (iVar1 == 0) {
      PVar2 = PlsR32F;
    }
    else {
      iVar1 = strcmp(str,"rg16f");
      if (iVar1 == 0) {
        PVar2 = PlsRG16F;
      }
      else {
        iVar1 = strcmp(str,"rg16");
        if (iVar1 == 0) {
          PVar2 = PlsRG16;
        }
        else {
          iVar1 = strcmp(str,"rgb10_a2");
          if (iVar1 == 0) {
            PVar2 = PlsRGB10A2;
          }
          else {
            iVar1 = strcmp(str,"rgba8");
            if (iVar1 == 0) {
              PVar2 = PlsRGBA8;
            }
            else {
              iVar1 = strcmp(str,"rgba8i");
              if (iVar1 == 0) {
                PVar2 = PlsRGBA8I;
              }
              else {
                iVar1 = strcmp(str,"rgba8ui");
                if (iVar1 == 0) {
                  PVar2 = PlsRGBA8UI;
                }
                else {
                  iVar1 = strcmp(str,"rg16i");
                  if (iVar1 == 0) {
                    PVar2 = PlsRG16I;
                  }
                  else {
                    iVar1 = strcmp(str,"rgb10_a2ui");
                    if (iVar1 == 0) {
                      PVar2 = PlsRGB10A2UI;
                    }
                    else {
                      iVar1 = strcmp(str,"rg16ui");
                      if (iVar1 == 0) {
                        PVar2 = PlsRG16UI;
                      }
                      else {
                        iVar1 = strcmp(str,"r32ui");
                        PVar2 = PlsR32UI;
                        if (iVar1 != 0) {
                          PVar2 = PlsNone;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return PVar2;
}

Assistant:

static PlsFormat pls_format(const char *str)
{
	if (!strcmp(str, "r11f_g11f_b10f"))
		return PlsR11FG11FB10F;
	else if (!strcmp(str, "r32f"))
		return PlsR32F;
	else if (!strcmp(str, "rg16f"))
		return PlsRG16F;
	else if (!strcmp(str, "rg16"))
		return PlsRG16;
	else if (!strcmp(str, "rgb10_a2"))
		return PlsRGB10A2;
	else if (!strcmp(str, "rgba8"))
		return PlsRGBA8;
	else if (!strcmp(str, "rgba8i"))
		return PlsRGBA8I;
	else if (!strcmp(str, "rgba8ui"))
		return PlsRGBA8UI;
	else if (!strcmp(str, "rg16i"))
		return PlsRG16I;
	else if (!strcmp(str, "rgb10_a2ui"))
		return PlsRGB10A2UI;
	else if (!strcmp(str, "rg16ui"))
		return PlsRG16UI;
	else if (!strcmp(str, "r32ui"))
		return PlsR32UI;
	else
		return PlsNone;
}